

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this,void **vtt)

{
  void **vtt_local;
  IfcDistributionElementType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionElementType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionElementType,_0UL> *)
             &(this->super_IfcElementType).field_0x180,vtt + 0x1f);
  IfcElementType::~IfcElementType(&this->super_IfcElementType,vtt + 1);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}